

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  int *piVar1;
  ImGuiWindow *pIVar2;
  float *pfVar3;
  ImGuiContext *pIVar4;
  float *pfVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ImGuiContext *ctx;
  
  pIVar4 = GImGui;
  iVar7 = components + -1;
  pIVar2 = GImGui->CurrentWindow;
  fVar12 = (GImGui->Style).ItemInnerSpacing.x;
  fVar10 = (float)(int)((w_full - fVar12 * (float)iVar7) / (float)components);
  fVar11 = 1.0;
  if (1.0 <= fVar10) {
    fVar11 = fVar10;
  }
  fVar10 = (float)(int)(w_full - (fVar12 + fVar11) * (float)iVar7);
  fVar12 = 1.0;
  if (1.0 <= fVar10) {
    fVar12 = fVar10;
  }
  iVar8 = (pIVar2->DC).ItemWidthStack.Size;
  if (iVar8 == (pIVar2->DC).ItemWidthStack.Capacity) {
    if (iVar8 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar8 / 2 + iVar8;
    }
    iVar9 = iVar8 + 1;
    if (iVar8 + 1 < iVar6) {
      iVar9 = iVar6;
    }
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    pfVar5 = (float *)(*GImAllocatorAllocFunc)((long)iVar9 << 2,GImAllocatorUserData);
    pfVar3 = (pIVar2->DC).ItemWidthStack.Data;
    if (pfVar3 != (float *)0x0) {
      memcpy(pfVar5,pfVar3,(long)(pIVar2->DC).ItemWidthStack.Size << 2);
      pfVar3 = (pIVar2->DC).ItemWidthStack.Data;
      if ((pfVar3 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pfVar3,GImAllocatorUserData);
    }
    (pIVar2->DC).ItemWidthStack.Data = pfVar5;
    (pIVar2->DC).ItemWidthStack.Capacity = iVar9;
    iVar8 = (pIVar2->DC).ItemWidthStack.Size;
  }
  else {
    pfVar5 = (pIVar2->DC).ItemWidthStack.Data;
  }
  pfVar5[iVar8] = fVar12;
  iVar8 = (pIVar2->DC).ItemWidthStack.Size + 1;
  (pIVar2->DC).ItemWidthStack.Size = iVar8;
  if (1 < components) {
    do {
      if (iVar8 == (pIVar2->DC).ItemWidthStack.Capacity) {
        if (iVar8 == 0) {
          iVar6 = 8;
        }
        else {
          iVar6 = iVar8 / 2 + iVar8;
        }
        iVar9 = iVar8 + 1;
        if (iVar8 + 1 < iVar6) {
          iVar9 = iVar6;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pfVar5 = (float *)(*GImAllocatorAllocFunc)((long)iVar9 << 2,GImAllocatorUserData);
        pfVar3 = (pIVar2->DC).ItemWidthStack.Data;
        if (pfVar3 != (float *)0x0) {
          memcpy(pfVar5,pfVar3,(long)(pIVar2->DC).ItemWidthStack.Size << 2);
          pfVar3 = (pIVar2->DC).ItemWidthStack.Data;
          if ((pfVar3 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pfVar3,GImAllocatorUserData);
        }
        (pIVar2->DC).ItemWidthStack.Data = pfVar5;
        (pIVar2->DC).ItemWidthStack.Capacity = iVar9;
        iVar8 = (pIVar2->DC).ItemWidthStack.Size;
      }
      else {
        pfVar5 = (pIVar2->DC).ItemWidthStack.Data;
      }
      pfVar5[iVar8] = fVar11;
      iVar8 = (pIVar2->DC).ItemWidthStack.Size + 1;
      (pIVar2->DC).ItemWidthStack.Size = iVar8;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  (pIVar2->DC).ItemWidth = (pIVar2->DC).ItemWidthStack.Data[(long)iVar8 + -1];
  *(byte *)&(pIVar4->NextItemData).Flags = (byte)(pIVar4->NextItemData).Flags & 0xfe;
  return;
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiStyle& style = g.Style;
    const float w_item_one  = ImMax(1.0f, IM_FLOOR((w_full - (style.ItemInnerSpacing.x) * (components - 1)) / (float)components));
    const float w_item_last = ImMax(1.0f, IM_FLOOR(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components - 1)));
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components - 1; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = window->DC.ItemWidthStack.back();
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}